

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O2

cmServerResponse * __thiscall
cmServerProtocol1::Process
          (cmServerResponse *__return_storage_ptr__,cmServerProtocol1 *this,cmServerRequest *request
          )

{
  __type _Var1;
  allocator<char> local_39;
  string local_38;
  
  if (0 < (int)this->m_State) {
    _Var1 = std::operator==(&request->Type,&kCACHE_TYPE_abi_cxx11_);
    if (_Var1) {
      ProcessCache(__return_storage_ptr__,this,request);
    }
    else {
      _Var1 = std::operator==(&request->Type,&kCMAKE_INPUTS_TYPE_abi_cxx11_);
      if (_Var1) {
        ProcessCMakeInputs(__return_storage_ptr__,this,request);
      }
      else {
        _Var1 = std::operator==(&request->Type,&kCODE_MODEL_TYPE_abi_cxx11_);
        if (_Var1) {
          ProcessCodeModel(__return_storage_ptr__,this,request);
        }
        else {
          _Var1 = std::operator==(&request->Type,&kCOMPUTE_TYPE_abi_cxx11_);
          if (_Var1) {
            ProcessCompute(__return_storage_ptr__,this,request);
          }
          else {
            _Var1 = std::operator==(&request->Type,&kCONFIGURE_TYPE_abi_cxx11_);
            if (_Var1) {
              ProcessConfigure(__return_storage_ptr__,this,request);
            }
            else {
              _Var1 = std::operator==(&request->Type,&kFILESYSTEM_WATCHERS_TYPE_abi_cxx11_);
              if (_Var1) {
                ProcessFileSystemWatchers(__return_storage_ptr__,this,request);
              }
              else {
                _Var1 = std::operator==(&request->Type,&kGLOBAL_SETTINGS_TYPE_abi_cxx11_);
                if (_Var1) {
                  ProcessGlobalSettings(__return_storage_ptr__,this,request);
                }
                else {
                  _Var1 = std::operator==(&request->Type,&kSET_GLOBAL_SETTINGS_TYPE_abi_cxx11_);
                  if (_Var1) {
                    ProcessSetGlobalSettings(__return_storage_ptr__,this,request);
                  }
                  else {
                    _Var1 = std::operator==(&request->Type,&kCTEST_INFO_TYPE_abi_cxx11_);
                    if (_Var1) {
                      ProcessCTests(__return_storage_ptr__,this,request);
                    }
                    else {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_38,"Unknown command!",&local_39);
                      cmServerRequest::ReportError(__return_storage_ptr__,request,&local_38);
                      std::__cxx11::string::~string((string *)&local_38);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    return __return_storage_ptr__;
  }
  __assert_fail("this->m_State >= STATE_ACTIVE",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmServerProtocol.cxx"
                ,0x180,
                "virtual const cmServerResponse cmServerProtocol1::Process(const cmServerRequest &)"
               );
}

Assistant:

const cmServerResponse cmServerProtocol1::Process(
  const cmServerRequest& request)
{
  assert(this->m_State >= STATE_ACTIVE);

  if (request.Type == kCACHE_TYPE) {
    return this->ProcessCache(request);
  }
  if (request.Type == kCMAKE_INPUTS_TYPE) {
    return this->ProcessCMakeInputs(request);
  }
  if (request.Type == kCODE_MODEL_TYPE) {
    return this->ProcessCodeModel(request);
  }
  if (request.Type == kCOMPUTE_TYPE) {
    return this->ProcessCompute(request);
  }
  if (request.Type == kCONFIGURE_TYPE) {
    return this->ProcessConfigure(request);
  }
  if (request.Type == kFILESYSTEM_WATCHERS_TYPE) {
    return this->ProcessFileSystemWatchers(request);
  }
  if (request.Type == kGLOBAL_SETTINGS_TYPE) {
    return this->ProcessGlobalSettings(request);
  }
  if (request.Type == kSET_GLOBAL_SETTINGS_TYPE) {
    return this->ProcessSetGlobalSettings(request);
  }
  if (request.Type == kCTEST_INFO_TYPE) {
    return this->ProcessCTests(request);
  }

  return request.ReportError("Unknown command!");
}